

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

bool __thiscall gui::TextBox::handleKeyPressed(TextBox *this,KeyEvent *key)

{
  size_type sVar1;
  long lVar2;
  byte bVar3;
  String *pSVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  KeyEvent *in_RSI;
  Widget *in_RDI;
  size_t in_stack_00000008;
  TextBox *in_stack_00000010;
  bool eventConsumed;
  size_t in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  String *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar3 = Widget::handleKeyPressed(in_RDI,in_RSI);
  if (in_RSI->code == Enter) {
    Signal<gui::Widget_*,_const_sf::String_&>::emit
              ((Signal<gui::Widget_*,_const_sf::String_&> *)
               CONCAT17(bVar3,in_stack_ffffffffffffffe0),in_RDI,in_stack_ffffffffffffffd0);
    return (bool)(bVar3 & 1);
  }
  if (in_RSI->code == BackSpace) {
    if ((((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) &&
       (in_RDI[1].name_.m_string.field_2._M_allocated_capacity != 0)) {
      if (in_RDI[1].name_.m_string._M_string_length != 0) {
        in_stack_ffffffffffffffd0 =
             (String *)
             (in_RDI[1].name_.m_string._M_string_length +
             *(long *)(in_RDI[1].transformable_.m_transform.m_matrix + 5));
        pSVar4 = (String *)sf::String::getSize((String *)0x28f185);
        if (pSVar4 <= in_stack_ffffffffffffffd0) {
          in_RDI[1].name_.m_string._M_string_length = in_RDI[1].name_.m_string._M_string_length - 1;
        }
      }
      sf::String::erase(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x28f1cd);
      updateCaretPosition(in_stack_00000010,in_stack_00000008);
      Signal<gui::Widget_*,_const_sf::String_&>::emit
                ((Signal<gui::Widget_*,_const_sf::String_&> *)
                 CONCAT17(bVar3,in_stack_ffffffffffffffe0),in_RDI,in_stack_ffffffffffffffd0);
    }
  }
  else if (in_RSI->code == Delete) {
    if (((((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) &&
        (uVar7 = in_RDI[1].name_.m_string.field_2._M_allocated_capacity,
        sVar5 = sf::String::getSize((String *)0x28f242), uVar7 < sVar5)) &&
       (sVar5 = sf::String::getSize((String *)0x28f264), sVar5 != 0)) {
      if ((in_RDI[1].name_.m_string._M_string_length != 0) &&
         (sVar1 = in_RDI[1].name_.m_string._M_string_length,
         lVar2 = *(long *)(in_RDI[1].transformable_.m_transform.m_matrix + 5),
         sVar5 = sf::String::getSize((String *)0x28f2a1), sVar5 <= sVar1 + lVar2)) {
        in_RDI[1].name_.m_string._M_string_length = in_RDI[1].name_.m_string._M_string_length - 1;
      }
      sf::String::erase(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x28f2e5);
      updateCaretPosition(in_stack_00000010,in_stack_00000008);
      Signal<gui::Widget_*,_const_sf::String_&>::emit
                ((Signal<gui::Widget_*,_const_sf::String_&> *)
                 CONCAT17(bVar3,in_stack_ffffffffffffffe0),in_RDI,in_stack_ffffffffffffffd0);
    }
  }
  else if ((in_RSI->code == End) &&
          (sVar5 = in_RDI[1].name_.m_string.field_2._M_allocated_capacity,
          sVar6 = sf::String::getSize((String *)0x28f340), sVar5 != sVar6)) {
    sf::String::getSize((String *)0x28f35e);
    updateCaretPosition(in_stack_00000010,in_stack_00000008);
  }
  else if ((in_RSI->code == Home) && (in_RDI[1].name_.m_string.field_2._M_allocated_capacity != 0))
  {
    updateCaretPosition(in_stack_00000010,in_stack_00000008);
  }
  else if (in_RSI->code == Left) {
    if ((((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) ||
       (in_RDI[1].name_.m_string._M_string_length == 0)) {
      if ((((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) &&
         (in_RDI[1].name_.m_string.field_2._M_allocated_capacity != 0)) {
        updateCaretPosition(in_stack_00000010,in_stack_00000008);
      }
    }
    else {
      updateCaretPosition(in_stack_00000010,in_stack_00000008);
    }
  }
  else {
    if (in_RSI->code != Right) {
      return (bool)(bVar3 & 1);
    }
    if (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) != 0) {
      uVar7 = in_RDI[1].name_.m_string._M_string_length +
              *(long *)(in_RDI[1].transformable_.m_transform.m_matrix + 5);
      sVar5 = sf::String::getSize((String *)0x28f453);
      if (uVar7 < sVar5) {
        updateCaretPosition(in_stack_00000010,in_stack_00000008);
        return true;
      }
    }
    if (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) {
      uVar7 = in_RDI[1].name_.m_string.field_2._M_allocated_capacity;
      sVar5 = sf::String::getSize((String *)0x28f4a8);
      if (uVar7 < sVar5) {
        updateCaretPosition(in_stack_00000010,in_stack_00000008);
      }
    }
  }
  return true;
}

Assistant:

bool TextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        onEnterPressed.emit(this, boxString_);
        return eventConsumed;
    } else if (key.code == sf::Keyboard::Backspace) {
        if (!readOnly_ && caretPosition_ > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_ - 1, 1);
            updateCaretPosition(caretPosition_ - 1);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::Delete) {
        if (!readOnly_ && caretPosition_ < boxString_.getSize() && boxString_.getSize() > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_, 1);
            updateCaretPosition(caretPosition_);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::End && caretPosition_ != boxString_.getSize()) {
        updateCaretPosition(boxString_.getSize());
    } else if (key.code == sf::Keyboard::Home && caretPosition_ != 0) {
        updateCaretPosition(0);
    } else if (key.code == sf::Keyboard::Left) {
        if (readOnly_ && horizontalScroll_ > 0) {
            updateCaretPosition(horizontalScroll_ - 1);
        } else if (!readOnly_ && caretPosition_ > 0) {
            updateCaretPosition(caretPosition_ - 1);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (readOnly_ && horizontalScroll_ + widthCharacters_ < boxString_.getSize()) {
            updateCaretPosition(horizontalScroll_ + widthCharacters_ + 1);
        } else if (!readOnly_ && caretPosition_ < boxString_.getSize()) {
            updateCaretPosition(caretPosition_ + 1);
        }
    } else {
        return eventConsumed;
    }
    return true;
}